

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O1

bool __thiscall wabt::WastLexer::MatchString(WastLexer *this,string_view s)

{
  char cVar1;
  char *pcVar2;
  uint uVar3;
  size_type sVar4;
  byte *pbVar5;
  byte *pbVar6;
  bool bVar7;
  
  bVar7 = s.size_ == 0;
  if (!bVar7) {
    pcVar2 = this->cursor_;
    sVar4 = 0;
    pbVar5 = (byte *)this->cursor_;
    do {
      cVar1 = s.data_[sVar4];
      uVar3 = 0xffffffff;
      pbVar6 = pbVar5;
      if (pbVar5 < this->buffer_end_) {
        pbVar6 = pbVar5 + 1;
        this->cursor_ = (char *)pbVar6;
        uVar3 = (uint)*pbVar5;
      }
      if (uVar3 != (int)cVar1) {
        this->cursor_ = pcVar2;
        return bVar7;
      }
      sVar4 = sVar4 + 1;
      bVar7 = s.size_ == sVar4;
      pbVar5 = pbVar6;
    } while (!bVar7);
  }
  return bVar7;
}

Assistant:

bool WastLexer::MatchString(string_view s) {
  const char* saved_cursor = cursor_;
  for (char c : s) {
    if (ReadChar() != c) {
      cursor_ = saved_cursor;
      return false;
    }
  }
  return true;
}